

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void MoveBeforeTable(TidyDocImpl *doc,Node *row,Node *node)

{
  Node *local_28;
  Node *table;
  Node *node_local;
  Node *row_local;
  TidyDocImpl *doc_local;
  
  local_28 = row->parent;
  while( true ) {
    if (local_28 == (Node *)0x0) {
      prvTidyInsertNodeBeforeElement(row->parent,node);
      return;
    }
    if (((local_28 != (Node *)0x0) && (local_28->tag != (Dict *)0x0)) &&
       (local_28->tag->id == TidyTag_TABLE)) break;
    local_28 = local_28->parent;
  }
  prvTidyInsertNodeBeforeElement(local_28,node);
  return;
}

Assistant:

static void MoveBeforeTable( TidyDocImpl* ARG_UNUSED(doc), Node *row,
                            Node *node )
{
    Node *table;

    /* first find the table element */
    for (table = row->parent; table; table = table->parent)
    {
        if ( nodeIsTABLE(table) )
        {
            TY_(InsertNodeBeforeElement)( table, node );
            return;
        }
    }
    /* No table element */
    TY_(InsertNodeBeforeElement)( row->parent, node );
}